

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

Script * __thiscall
cfd::core::Psbt::GetTxInRedeemScriptDirect
          (Script *__return_storage_ptr__,Psbt *this,uint32_t index,bool ignore_error,
          bool is_witness)

{
  void *pvVar1;
  CfdException *this_00;
  long lVar2;
  undefined3 in_register_00000081;
  undefined1 local_50 [32];
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0xa4f,"GetTxInRedeemScriptDirect");
  pvVar1 = this->wally_psbt_pointer_;
  if (CONCAT31(in_register_00000081,is_witness) != 0) {
    lVar2 = (ulong)index * 0x110;
    if (*(long *)(*(long *)((long)pvVar1 + 0x10) + 0x20 + lVar2) != 0) {
      ByteData::ByteData((ByteData *)local_50,
                         *(uint8_t **)(*(long *)((long)pvVar1 + 0x10) + 0x20 + lVar2),
                         *(uint32_t *)(*(long *)((long)pvVar1 + 0x10) + 0x28 + lVar2));
      Script::Script(__return_storage_ptr__,(ByteData *)local_50);
      goto LAB_00359d9d;
    }
    if (is_witness) goto LAB_00359dae;
  }
  lVar2 = (ulong)index * 0x110;
  if (*(long *)(*(long *)((long)pvVar1 + 0x10) + 0x10 + lVar2) == 0) {
LAB_00359dae:
    if (ignore_error) {
      Script::Script(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_50._0_8_ = "cfdcore_psbt.cpp";
    local_50._8_4_ = 0xa61;
    local_50._16_8_ = "GetTxInRedeemScriptDirect";
    logger::log<>((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"script not found.");
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_50._0_8_ = local_50 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"psbt script not found error.","");
    CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_50);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData((ByteData *)local_50,
                     *(uint8_t **)(*(long *)((long)pvVar1 + 0x10) + 0x10 + lVar2),
                     *(uint32_t *)(*(long *)((long)pvVar1 + 0x10) + 0x18 + lVar2));
  Script::Script(__return_storage_ptr__,(ByteData *)local_50);
LAB_00359d9d:
  if ((pointer)local_50._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_50._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

Script Psbt::GetTxInRedeemScriptDirect(
    uint32_t index, bool ignore_error, bool is_witness) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  if (is_witness && (psbt_pointer->inputs[index].witness_script != nullptr)) {
    return Script(ByteData(
        psbt_pointer->inputs[index].witness_script,
        static_cast<uint32_t>(
            psbt_pointer->inputs[index].witness_script_len)));
  } else if (
      (!is_witness) &&
      (psbt_pointer->inputs[index].redeem_script != nullptr)) {
    return Script(ByteData(
        psbt_pointer->inputs[index].redeem_script,
        static_cast<uint32_t>(psbt_pointer->inputs[index].redeem_script_len)));
  } else if (ignore_error) {
    return Script();
  } else {
    warn(CFD_LOG_SOURCE, "script not found.");
    throw CfdException(kCfdIllegalStateError, "psbt script not found error.");
  }
}